

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_flbi.c
# Opt level: O3

char * cmime_flbi_get_boundary(char *s)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  
  pcVar2 = strcasestr(s,"boundary=");
  if (pcVar2 != (char *)0x0) {
    pcVar3 = strchr(pcVar2,0x3d);
    pcVar2 = pcVar3 + 1;
    if (pcVar3[1] == '\"') {
      pcVar2 = pcVar3 + 2;
    }
    sVar4 = strlen(pcVar2);
    pcVar3 = (char *)calloc(sVar4 + 1,1);
    for (uVar5 = 0; cVar1 = pcVar2[uVar5], cVar1 != '\0'; uVar5 = uVar5 + 1) {
      if ((cVar1 == '\"') || (cVar1 == ';')) {
        pcVar3[uVar5 & 0xffffffff] = '\0';
        goto LAB_00106129;
      }
      pcVar3[uVar5] = cVar1;
    }
    if (pcVar3 != (char *)0x0) {
LAB_00106129:
      pcVar2 = cmime_string_strip(pcVar3);
      if (pcVar2 == pcVar3) {
        return pcVar2;
      }
      pcVar2 = strdup(pcVar2);
      free(pcVar3);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

char *cmime_flbi_get_boundary(char *s) {
    char *t = NULL;
    char *boundary = NULL;  
    char *p = NULL;
    int pos = 0;

    p = strcasestr(s,"boundary=");
    if (p != NULL) {
        s = strstr(p,"=");
        if (*++s=='"') 
            s++;
                
        t = (char *)calloc(strlen(s) + sizeof(char),sizeof(char));
        while(*s!='\0') {
            if ((*s!=';') && (*s!='"'))
                t[pos++] = *s;
            else {
                t[pos] = '\0';
                break;
            }
            s++;
        }
    }

    if (t != NULL) {
        char *stripped = cmime_string_strip(t);
        if (stripped != t) {
            boundary = strdup(stripped);
            free(t);
        } else
            boundary = stripped;
    } else
        boundary = t;

    return boundary;
}